

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall SmallArray<VmValue_*,_8U>::~SmallArray(SmallArray<VmValue_*,_8U> *this)

{
  VmValue **ppVVar1;
  
  ppVVar1 = this->data;
  if (ppVVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppVVar1 != (VmValue **)0x0) {
        (*(code *)NULLC::dealloc)(ppVVar1);
      }
    }
    else if (ppVVar1 != (VmValue **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}